

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

int vok_at_loc(char *file,int line,int test,char *fmt,__va_list_tag *args)

{
  char *__ptr;
  
  __ptr = vstrdupf(fmt,args);
  if (test == 0) {
    printf("not ");
  }
  current_test = current_test + 1;
  printf("ok %d");
  if (*__ptr != '\0') {
    printf(" - %s",__ptr);
  }
  if (todo_mesg != (char *)0x0) {
    printf(" # TODO");
    if (*todo_mesg != '\0') {
      printf(" %s");
    }
  }
  putchar(10);
  if (test == 0) {
    printf("#   Failed ");
    if (todo_mesg != (char *)0x0) {
      printf("(TODO) ");
    }
    printf("test ");
    if (*__ptr != '\0') {
      printf("\'%s\'\n#   ",__ptr);
    }
    printf("at %s line %d.\n",file,line);
    if (todo_mesg == (char *)0x0) {
      failed_tests = failed_tests + 1;
    }
  }
  free(__ptr);
  return test;
}

Assistant:

int
vok_at_loc (const char *file, int line, int test, const char *fmt,
            va_list args)
{
    char *name = vstrdupf(fmt, args);
    if (!test) {
        printf("not ");
    }
    printf("ok %d", ++current_test);
    if (*name)
        printf(" - %s", name);
    if (todo_mesg) {
        printf(" # TODO");
        if (*todo_mesg)
            printf(" %s", todo_mesg);
    }
    printf("\n");
    if (!test) {
        printf("#   Failed ");
        if (todo_mesg)
            printf("(TODO) ");
        printf("test ");
        if (*name)
            printf("'%s'\n#   ", name);
        printf("at %s line %d.\n", file, line);
        if (!todo_mesg)
            failed_tests++;
    }
    free(name);
    return test;
}